

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<cfd::js::api::DecodePsbtInputStruct,_std::allocator<cfd::js::api::DecodePsbtInputStruct>_> *
__thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::DecodePsbtInput,_cfd::js::api::DecodePsbtInputStruct>::
ConvertToStruct(vector<cfd::js::api::DecodePsbtInputStruct,_std::allocator<cfd::js::api::DecodePsbtInputStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::DecodePsbtInput,_cfd::js::api::DecodePsbtInputStruct>
               *this)

{
  bool bVar1;
  undefined1 local_4b8 [8];
  DecodePsbtInputStruct data;
  DecodePsbtInput *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::js::api::json::DecodePsbtInput,_cfd::js::api::DecodePsbtInputStruct>
  *__range3;
  JsonObjectVector<cfd::js::api::json::DecodePsbtInput,_cfd::js::api::DecodePsbtInputStruct>
  *this_local;
  vector<cfd::js::api::DecodePsbtInputStruct,_std::allocator<cfd::js::api::DecodePsbtInputStruct>_>
  *result;
  
  std::
  vector<cfd::js::api::DecodePsbtInputStruct,_std::allocator<cfd::js::api::DecodePsbtInputStruct>_>
  ::vector(__return_storage_ptr__);
  __end0 = std::
           vector<cfd::js::api::json::DecodePsbtInput,_std::allocator<cfd::js::api::json::DecodePsbtInput>_>
           ::begin(&(this->super_JsonVector<cfd::js::api::json::DecodePsbtInput>).
                    super_vector<cfd::js::api::json::DecodePsbtInput,_std::allocator<cfd::js::api::json::DecodePsbtInput>_>
                  );
  element = (DecodePsbtInput *)
            std::
            vector<cfd::js::api::json::DecodePsbtInput,_std::allocator<cfd::js::api::json::DecodePsbtInput>_>
            ::end(&(this->super_JsonVector<cfd::js::api::json::DecodePsbtInput>).
                   super_vector<cfd::js::api::json::DecodePsbtInput,_std::allocator<cfd::js::api::json::DecodePsbtInput>_>
                 );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_cfd::js::api::json::DecodePsbtInput_*,_std::vector<cfd::js::api::json::DecodePsbtInput,_std::allocator<cfd::js::api::json::DecodePsbtInput>_>_>
                                     *)&element), bVar1) {
    data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_cfd::js::api::json::DecodePsbtInput_*,_std::vector<cfd::js::api::json::DecodePsbtInput,_std::allocator<cfd::js::api::json::DecodePsbtInput>_>_>
                 ::operator*(&__end0);
    js::api::json::DecodePsbtInput::ConvertToStruct
              ((DecodePsbtInputStruct *)local_4b8,
               (DecodePsbtInput *)data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count
              );
    std::
    vector<cfd::js::api::DecodePsbtInputStruct,_std::allocator<cfd::js::api::DecodePsbtInputStruct>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_4b8);
    js::api::DecodePsbtInputStruct::~DecodePsbtInputStruct((DecodePsbtInputStruct *)local_4b8);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::json::DecodePsbtInput_*,_std::vector<cfd::js::api::json::DecodePsbtInput,_std::allocator<cfd::js::api::json::DecodePsbtInput>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }